

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

uint32_t icu_63::GreekUpper::getLetterData(UChar32 c)

{
  uint local_c;
  UChar32 c_local;
  
  if (((c < 0x370) || (0x2126 < c)) || ((0x3ff < c && (c < 0x1f00)))) {
    local_c = 0;
  }
  else if (c < 0x400) {
    local_c = (uint)*(ushort *)(data0370 + (long)(c + -0x370) * 2);
  }
  else if (c < 0x2000) {
    local_c = (uint)*(ushort *)(data1F00 + (long)(c + -0x1f00) * 2);
  }
  else if (c == 0x2126) {
    local_c = 0x13a9;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

uint32_t getLetterData(UChar32 c) {
    if (c < 0x370 || 0x2126 < c || (0x3ff < c && c < 0x1f00)) {
        return 0;
    } else if (c <= 0x3ff) {
        return data0370[c - 0x370];
    } else if (c <= 0x1fff) {
        return data1F00[c - 0x1f00];
    } else if (c == 0x2126) {
        return data2126;
    } else {
        return 0;
    }
}